

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locale.cpp
# Opt level: O0

void __thiscall f8n::i18n::Locale::Initialize(Locale *this,string *localePath)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *path;
  bool bVar1;
  reference pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  string local_f0;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fn;
  iterator __end2;
  iterator __begin2;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  iterator local_60;
  size_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *localePath_local;
  Locale *this_local;
  
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)localePath;
  localePath_local = (string *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->locales);
  std::__cxx11::string::operator=((string *)&this->localePath,(string *)__range2);
  bVar1 = env::fs::Exists((string *)__range2);
  path = __range2;
  if (bVar1) {
    __begin2._M_current._3_1_ = 1;
    local_88 = &local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"json",&local_89);
    __begin2._M_current._3_1_ = 0;
    local_60 = &local_80;
    local_58 = 1;
    this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&__begin2._M_current + 2);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_00);
    __l._M_len = local_58;
    __l._M_array = local_60;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_50,__l,this_00);
    env::fs::FindFilesWithExtensions(&local_38,(string *)path,&local_50,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__begin2._M_current + 2));
    local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
    do {
      local_120 = local_120 + -1;
      std::__cxx11::string::~string((string *)local_120);
    } while (local_120 != &local_80);
    std::allocator<char>::~allocator(&local_89);
    local_20 = &local_38;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_20);
    fn.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_20);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&fn.field_2 + 8)), bVar1) {
      pbVar2 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_d0,(string *)pbVar2);
      env::fs::Filename(&local_f0,(string *)local_d0);
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->locales,(value_type *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
  }
  SetSelectedLocale(this,&this->selectedLocale);
  return;
}

Assistant:

void Locale::Initialize(const std::string& localePath) {
    this->locales.clear();
    this->localePath = localePath;

    if (fs::Exists(localePath)) {
        for (auto fn : fs::FindFilesWithExtensions(localePath, { "json" }, false)) {
            fn = fs::Filename(fn);
            this->locales.push_back(fn);
        }
    }

    this->SetSelectedLocale(this->selectedLocale);
}